

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

uint AddString(TidyPrintImpl *pprint,ctmbstr str)

{
  uint uVar1;
  ctmbstr str_local;
  TidyPrintImpl *pprint_local;
  
  uVar1 = AddAsciiString(pprint,str,pprint->linelen);
  pprint->linelen = uVar1;
  return uVar1;
}

Assistant:

static uint AddString( TidyPrintImpl* pprint, ctmbstr str )
{
   return pprint->linelen = AddAsciiString( pprint, str, pprint->linelen );
}